

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_huge_repeat(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0x106;
          }
          else {
            pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uVar3 = 0x105;
          }
        }
        else {
          pcVar4 = "0 == uv_timer_start(&huge_timer1, huge_repeat_cb, 1, (uint64_t) -1)";
          uVar3 = 0x104;
        }
      }
      else {
        pcVar4 = "0 == uv_timer_start(&tiny_timer, huge_repeat_cb, 2, 2)";
        uVar3 = 0x103;
      }
    }
    else {
      pcVar4 = "0 == uv_timer_init(uv_default_loop(), &huge_timer1)";
      uVar3 = 0x102;
    }
  }
  else {
    pcVar4 = "0 == uv_timer_init(uv_default_loop(), &tiny_timer)";
    uVar3 = 0x101;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(timer_huge_repeat) {
  ASSERT(0 == uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT(0 == uv_timer_start(&tiny_timer, huge_repeat_cb, 2, 2));
  ASSERT(0 == uv_timer_start(&huge_timer1, huge_repeat_cb, 1, (uint64_t) -1));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY();
  return 0;
}